

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::EmitLoadConstInt(SQCompiler *this,SQInteger value,SQInteger target)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInstruction local_20;
  
  if (target < 0) {
    target = SQFuncState::PushTarget(this->_fs,-1);
  }
  this_00 = this->_fs;
  if (value + 0x7fffffffU < 0xffffffff) {
    local_20.op = '\x02';
    local_20._arg1 = (SQInt32)value;
  }
  else {
    SVar1 = SQFuncState::GetNumericConstant(this_00,value);
    local_20.op = '\x01';
    local_20._arg1 = (SQInt32)SVar1;
  }
  local_20._arg2 = '\0';
  local_20._arg3 = '\0';
  local_20._arg0 = (uchar)target;
  SQFuncState::AddInstruction(this_00,&local_20);
  return;
}

Assistant:

void EmitLoadConstInt(SQInteger value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(value <= INT_MAX && value > INT_MIN) { //does it fit in 32 bits?
            _fs->AddInstruction(_OP_LOADINT, target,value);
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }